

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.hh
# Opt level: O3

bool __thiscall Typelib::EndianSwapVisitor::visit_(EndianSwapVisitor *this,Value *v,Pointer *t)

{
  UnsupportedEndianSwap *this_00;
  string local_40;
  
  this_00 = (UnsupportedEndianSwap *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"pointers","");
  UnsupportedEndianSwap::UnsupportedEndianSwap(this_00,&local_40);
  __cxa_throw(this_00,&UnsupportedEndianSwap::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool visit_ (Value const& v, Pointer const& t) { throw UnsupportedEndianSwap("pointers"); }